

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O0

void __thiscall tlx::CmdlineParser::Argument::~Argument(Argument *this)

{
  Argument *this_local;
  
  this->_vptr_Argument = (_func_int **)&PTR__Argument_001e6920;
  std::__cxx11::string::~string((string *)&this->desc_);
  std::__cxx11::string::~string((string *)&this->keytype_);
  std::__cxx11::string::~string((string *)&this->longkey_);
  return;
}

Assistant:

virtual ~Argument() = default;